

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLEBTensorOp.cpp
# Opt level: O3

void __thiscall
amrex::MLEBTensorOp::compCrossTerms(MLEBTensorOp *this,int amrlev,int mglev,MultiFab *mf)

{
  double dVar1;
  double dVar2;
  double dVar3;
  FabArrayBase *pFVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  FabType FVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  int *piVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  int iVar32;
  int iVar33;
  uint uVar34;
  long lVar35;
  int iVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  long lVar43;
  uint uVar44;
  long lVar45;
  long lVar46;
  long lVar47;
  int iVar48;
  long lVar49;
  uint uVar50;
  long lVar51;
  void *pvVar52;
  Geometry *this_00;
  uint uVar53;
  long lVar54;
  long lVar55;
  int iVar56;
  long lVar57;
  long lVar58;
  bool bVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  double dVar64;
  double dVar65;
  double dVar66;
  double dVar67;
  double dVar68;
  double dVar69;
  double dVar70;
  Box zbx;
  Box ybx;
  Box xbx;
  Array4<const_double> vfab;
  Box result;
  Array4<double> fzfab;
  Array4<double> fyfab;
  Array4<const_double> etazfab;
  Array4<const_double> etayfab;
  Array4<const_double> etaxfab;
  Array4<const_double> kapzfab;
  Array4<const_double> kapyfab;
  Array4<const_double> kapxfab;
  MFIter mfi;
  int local_6d8;
  long local_6c0;
  long local_6b8;
  long local_6a0;
  long local_688;
  long local_650;
  int local_590;
  Box local_58c;
  Box local_570;
  Box local_554;
  Array4<const_double> local_538;
  FabArray<amrex::EBCellFlagFab> *local_4f8;
  FabArray<amrex::FArrayBox> *local_4f0;
  ulong local_4e8;
  double local_4e0;
  double local_4d8;
  double local_4d0;
  int local_4c4;
  uint local_4c0;
  undefined1 local_4b8 [28];
  undefined4 uStack_49c;
  int local_498;
  int local_494;
  int local_490;
  FabArray<amrex::FArrayBox> *local_478;
  FabArray<amrex::FArrayBox> *local_470;
  FabArray<amrex::FArrayBox> *local_468;
  FabArray<amrex::FArrayBox> *local_460;
  FabArray<amrex::FArrayBox> *local_458;
  long local_450;
  Array4<double> local_448;
  Array4<double> local_408;
  Array4<const_amrex::EBCellFlag> local_3c8;
  MultiCutFab *local_388;
  MultiCutFab *pMStack_380;
  MultiCutFab *local_378;
  long local_368;
  double local_360;
  double local_358;
  double local_350;
  FabArray<amrex::FArrayBox> *local_348;
  FabArray<amrex::FArrayBox> *local_340;
  FabArray<amrex::FArrayBox> *local_338;
  FabArray<amrex::FArrayBox> *local_330;
  ulong local_328;
  long local_320;
  ulong local_318;
  long local_310;
  long local_308;
  Array4<const_double> local_300;
  Array4<const_double> local_2c0;
  Array4<const_double> local_280;
  Array4<const_double> local_240;
  Array4<const_double> local_200;
  Array4<const_double> local_1c0;
  IntVect local_180;
  int local_160 [2];
  int local_158;
  Vector<int,_std::allocator<int>_> *local_140;
  Array4<const_double> local_120;
  Array4<const_double> local_e0;
  Array4<const_double> local_a0;
  Box local_60;
  MFItInfo local_44;
  
  lVar57 = (long)mglev;
  lVar13 = *(long *)(*(long *)&(this->super_MLEBABecLap).super_MLCellABecLap.super_MLCellLinOp.
                               super_MLLinOp.m_factory.
                               super_vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                               .
                               super__Vector_base<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[amrlev].
                               super_vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                               .
                               super__Vector_base<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                    + lVar57 * 8);
  local_468 = &mf->super_FabArray<amrex::FArrayBox>;
  if ((lVar13 == 0) ||
     (lVar13 = __dynamic_cast(lVar13,&FabFactory<amrex::FArrayBox>::typeinfo,
                              &EBFArrayBoxFactory::typeinfo,0), lVar13 == 0)) {
    local_388 = (MultiCutFab *)0x0;
    pMStack_380 = (MultiCutFab *)0x0;
    local_378 = (MultiCutFab *)0x0;
    local_4f8 = (FabArray<amrex::EBCellFlagFab> *)0x0;
  }
  else {
    local_4f8 = EBDataCollection::getMultiEBCellFlagFab(*(EBDataCollection **)(lVar13 + 0xd8));
    EBDataCollection::getAreaFrac(*(EBDataCollection **)(lVar13 + 0xd8));
  }
  lVar13 = *(long *)&(this->super_MLEBABecLap).super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.
                     m_geom.
                     super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                     .
                     super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[amrlev].
                     super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                     super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
  local_368 = lVar57 * 200;
  local_4d0 = *(double *)(lVar13 + 0x38 + local_368);
  local_4d8 = *(double *)(lVar13 + 0x40 + local_368);
  lVar57 = lVar57 * 0x480;
  local_470 = (FabArray<amrex::FArrayBox> *)
              (*(long *)&(this->super_MLEBABecLap).m_b_coeffs.
                         super_vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                         .
                         super__Vector_base<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[amrlev].
                         super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                         .
                         super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
              + lVar57);
  local_478 = (FabArray<amrex::FArrayBox> *)
              (*(long *)&(this->m_kappa).
                         super_vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                         .
                         super__Vector_base<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[amrlev].
                         super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                         .
                         super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
              + lVar57);
  local_4f0 = (FabArray<amrex::FArrayBox> *)
              (lVar57 + *(long *)&(this->m_tauflux).
                                  super_vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                                  .
                                  super__Vector_base<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[amrlev].
                                  super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                                  .
                                  super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
              );
  local_4e0 = *(double *)(lVar13 + 0x48 + local_368);
  local_44.num_streams = Gpu::Device::max_gpu_streams;
  local_44.do_tiling = true;
  local_44.tilesize.vect[0] = (int)FabArrayBase::mfiter_tile_size;
  local_44.tilesize.vect[1] = FabArrayBase::mfiter_tile_size._4_4_;
  local_44.tilesize.vect[2] = DAT_00717ec0;
  local_44.dynamic = true;
  local_44.device_sync = true;
  MFIter::MFIter((MFIter *)&local_180,&local_468->super_FabArrayBase,&local_44);
  if (local_160[0] < local_158) {
    local_458 = local_4f0 + 1;
    local_460 = local_4f0 + 2;
    local_340 = local_470 + 1;
    local_348 = local_470 + 2;
    local_330 = local_478 + 1;
    local_338 = local_478 + 2;
    local_350 = local_4d8 * 0.5;
    local_358 = local_4e0 * 0.5;
    local_360 = local_4d0 * 0.5;
    local_4d8 = local_4d8 * 0.25;
    local_4e0 = local_4e0 * 0.25;
    local_4d0 = local_4d0 * 0.25;
    do {
      MFIter::tilebox(&local_60,(MFIter *)&local_180);
      MFIter::nodaltilebox(&local_554,(MFIter *)&local_180,0);
      MFIter::nodaltilebox(&local_570,(MFIter *)&local_180,1);
      MFIter::nodaltilebox(&local_58c,(MFIter *)&local_180,2);
      if (local_4f8 == (FabArray<amrex::EBCellFlagFab> *)0x0) {
        FVar10 = regular;
LAB_0060a287:
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((Array4<double> *)local_4b8,local_4f0,(MFIter *)&local_180);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&local_408,local_458,(MFIter *)&local_180);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&local_448,local_460,(MFIter *)&local_180);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_538,local_468,(MFIter *)&local_180);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_280,local_470,(MFIter *)&local_180);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_2c0,local_340,(MFIter *)&local_180);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_300,local_348,(MFIter *)&local_180);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_1c0,local_478,(MFIter *)&local_180);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_200,local_330,(MFIter *)&local_180);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_240,local_338,(MFIter *)&local_180);
        if (FVar10 == regular) {
          if (local_554.smallend.vect[2] <= local_554.bigend.vect[2]) {
            lVar22 = (long)local_554.smallend.vect[1];
            lVar57 = (long)local_554.smallend.vect[0] * 8;
            iVar26 = local_554.smallend.vect[2];
            do {
              if (local_554.smallend.vect[1] <= local_554.bigend.vect[1]) {
                lVar30 = (long)((iVar26 + 1) - local_538.begin.z);
                lVar58 = (long)local_498;
                lVar55 = CONCAT44(local_4b8._12_4_,local_4b8._8_4_) * 8;
                lVar54 = (lVar22 - local_494) * lVar55 +
                         (long)(iVar26 - local_490) * CONCAT44(local_4b8._20_4_,local_4b8._16_4_) *
                         8;
                lVar49 = local_4b8._0_8_ + lVar54 + lVar58 * -8 + lVar57;
                lVar17 = local_4b8._0_8_ +
                         lVar54 + CONCAT44(uStack_49c,local_4b8._24_4_) * 8 + lVar58 * -8 + lVar57;
                lVar28 = local_4b8._0_8_ +
                         CONCAT44(uStack_49c,local_4b8._24_4_) * 0x10 + lVar54 + lVar58 * -8 +
                         lVar57;
                lVar15 = local_280.jstride * 8;
                lVar54 = (lVar22 - local_280.begin.y) * lVar15 +
                         (iVar26 - local_280.begin.z) * local_280.kstride * 8;
                lVar21 = (long)local_280.p + lVar54 + (long)local_280.begin.x * -8 + lVar57;
                lVar16 = (long)local_280.p +
                         lVar54 + local_280.nstride * 8 + (long)local_280.begin.x * -8 + lVar57;
                lVar54 = local_538.jstride * 8;
                lVar58 = (lVar22 - local_538.begin.y) * lVar54;
                lVar47 = local_538.kstride * 8;
                lVar24 = (~local_538.begin.z + iVar26) * lVar47 + lVar58;
                lVar58 = lVar30 * lVar47 + lVar58;
                lVar37 = local_538.kstride * (iVar26 - local_538.begin.z);
                lVar47 = lVar47 * (iVar26 - local_538.begin.z);
                lVar31 = (long)local_538.begin.x;
                lVar29 = (long)local_538.p +
                         lVar24 + local_538.nstride * 0x10 + lVar31 * -8 + lVar57;
                lVar18 = (long)local_538.p + lVar24 + lVar31 * -8 + lVar57;
                lVar19 = (long)local_538.p +
                         local_538.nstride * 0x10 + lVar58 + lVar31 * -8 + lVar57;
                lVar35 = (long)local_538.p + lVar58 + lVar31 * -8 + lVar57;
                lVar58 = lVar47 + lVar31 * -8 + lVar57;
                lVar31 = lVar47 + local_538.nstride * 8 + lVar31 * -8 + lVar57;
                lVar47 = (long)local_1c0.p +
                         (lVar22 - local_1c0.begin.y) * local_1c0.jstride * 8 +
                         (iVar26 - local_1c0.begin.z) * local_1c0.kstride * 8 +
                         (long)local_1c0.begin.x * -8 + lVar57;
                iVar33 = (local_554.smallend.vect[1] + 1) - local_538.begin.y;
                iVar36 = (local_554.smallend.vect[1] + -1) - local_538.begin.y;
                lVar24 = lVar22;
                do {
                  iVar27 = (int)(lVar24 + 1);
                  if (local_554.smallend.vect[0] <= local_554.bigend.vect[0]) {
                    lVar38 = (lVar24 - local_538.begin.y) * local_538.jstride;
                    lVar42 = 0;
                    do {
                      dVar61 = *(double *)
                                ((long)local_538.p + lVar42 * 8 + iVar33 * lVar54 + lVar58);
                      lVar45 = (long)(((local_554.smallend.vect[0] + -1) - local_538.begin.x) +
                                     (int)lVar42);
                      dVar67 = local_538.p
                               [lVar37 + (iVar27 - local_538.begin.y) * local_538.jstride + lVar45];
                      dVar60 = *(double *)
                                ((long)local_538.p + lVar42 * 8 + iVar36 * lVar54 + lVar58);
                      dVar62 = local_538.p
                               [lVar37 + (~local_538.begin.y + (int)lVar24) * local_538.jstride +
                                         lVar45];
                      dVar64 = *(double *)(lVar35 + lVar42 * 8);
                      dVar2 = local_538.p[lVar38 + lVar45 + local_538.kstride * lVar30];
                      dVar63 = *(double *)(lVar18 + lVar42 * 8);
                      dVar68 = local_538.p
                               [lVar38 + lVar45 + local_538.kstride * (~local_538.begin.z + iVar26)]
                      ;
                      dVar66 = (((*(double *)(lVar19 + lVar42 * 8) +
                                 (local_538.p + lVar38 + lVar45 + local_538.kstride * lVar30)
                                 [local_538.nstride * 2]) - *(double *)(lVar29 + lVar42 * 8)) -
                               (local_538.p +
                               lVar38 + lVar45 + local_538.kstride * (~local_538.begin.z + iVar26))
                               [local_538.nstride * 2]) * local_4e0 +
                               (((*(double *)
                                   ((long)local_538.p + lVar42 * 8 + iVar33 * lVar54 + lVar31) +
                                 (local_538.p +
                                 lVar37 + (iVar27 - local_538.begin.y) * local_538.jstride + lVar45)
                                 [local_538.nstride]) -
                                *(double *)
                                 ((long)local_538.p + lVar42 * 8 + iVar36 * lVar54 + lVar31)) -
                               (local_538.p +
                               lVar37 + (~local_538.begin.y + (int)lVar24) * local_538.jstride +
                                        lVar45)[local_538.nstride]) * local_4d8;
                      dVar3 = *(double *)(lVar47 + lVar42 * 8);
                      dVar65 = *(double *)(lVar16 + lVar42 * 8);
                      *(double *)(lVar49 + lVar42 * 8) =
                           dVar66 * -0.6666666666666666 *
                           (*(double *)(lVar21 + lVar42 * 8) - dVar3) * -0.75 - dVar66 * dVar3;
                      dVar65 = -dVar65;
                      *(double *)(lVar17 + lVar42 * 8) =
                           (((dVar61 + dVar67) - dVar60) - dVar62) * local_4d8 * dVar65;
                      *(double *)(lVar28 + lVar42 * 8) =
                           dVar65 * (((dVar64 + dVar2) - dVar63) - dVar68) * local_4e0;
                      lVar42 = lVar42 + 1;
                    } while ((local_554.bigend.vect[0] - local_554.smallend.vect[0]) + 1 !=
                             (int)lVar42);
                  }
                  lVar49 = lVar49 + lVar55;
                  lVar17 = lVar17 + lVar55;
                  lVar28 = lVar28 + lVar55;
                  lVar21 = lVar21 + lVar15;
                  lVar16 = lVar16 + lVar15;
                  lVar29 = lVar29 + lVar54;
                  lVar18 = lVar18 + lVar54;
                  lVar19 = lVar19 + lVar54;
                  lVar35 = lVar35 + lVar54;
                  iVar33 = iVar33 + 1;
                  iVar36 = iVar36 + 1;
                  lVar47 = lVar47 + local_1c0.jstride * 8;
                  lVar24 = lVar24 + 1;
                } while (local_554.bigend.vect[1] + 1 != iVar27);
              }
              iVar26 = iVar26 + 1;
            } while (iVar26 != local_554.bigend.vect[2] + 1);
          }
          if (local_570.smallend.vect[2] <= local_570.bigend.vect[2]) {
            lVar22 = (long)local_570.smallend.vect[1];
            lVar57 = (long)local_570.smallend.vect[0] * 8;
            iVar26 = local_570.smallend.vect[2];
            do {
              if (local_570.smallend.vect[1] <= local_570.bigend.vect[1]) {
                lVar58 = (long)local_408.begin.x;
                lVar29 = local_408.jstride * 8;
                lVar54 = (lVar22 - local_408.begin.y) * lVar29 +
                         (iVar26 - local_408.begin.z) * local_408.kstride * 8;
                lVar24 = (long)local_408.p + lVar54 + lVar58 * -8 + lVar57;
                lVar35 = (long)local_408.p + lVar54 + local_408.nstride * 8 + lVar58 * -8 + lVar57;
                lVar19 = (long)local_408.p +
                         local_408.nstride * 0x10 + lVar54 + lVar58 * -8 + lVar57;
                lVar18 = local_2c0.jstride * 8;
                lVar54 = (lVar22 - local_2c0.begin.y) * lVar18 +
                         (iVar26 - local_2c0.begin.z) * local_2c0.kstride * 8;
                lVar21 = (long)local_2c0.p +
                         lVar54 + local_2c0.nstride * 8 + (long)local_2c0.begin.x * -8 + lVar57;
                lVar17 = (long)local_2c0.p + lVar54 + (long)local_2c0.begin.x * -8 + lVar57;
                lVar54 = local_538.jstride * 8;
                lVar49 = (lVar22 - local_538.begin.y) * lVar54;
                lVar58 = local_538.kstride * 8;
                lVar47 = (~local_538.begin.z + iVar26) * lVar58;
                lVar16 = local_538.nstride * 0x10;
                lVar31 = (long)local_538.begin.x;
                lVar37 = (long)local_538.p + lVar49 + lVar47 + lVar16 + lVar31 * -8 + lVar57;
                local_6b8 = (long)local_538.p +
                            lVar49 + lVar47 + local_538.nstride * 8 + lVar31 * -8 + lVar57;
                lVar38 = ((iVar26 + 1) - local_538.begin.z) * lVar58;
                lVar30 = (long)local_538.p + lVar49 + lVar38 + lVar16 + lVar31 * -8 + lVar57;
                lVar15 = (long)local_538.p +
                         lVar49 + lVar38 + local_538.nstride * 8 + lVar31 * -8 + lVar57;
                lVar28 = (long)local_200.p +
                         (lVar22 - local_200.begin.y) * local_200.jstride * 8 +
                         (iVar26 - local_200.begin.z) * local_200.kstride * 8 +
                         (long)local_200.begin.x * -8 + lVar57;
                lVar55 = local_538.kstride * (iVar26 - local_538.begin.z);
                lVar49 = lVar58 * (iVar26 - local_538.begin.z) + lVar49;
                lVar58 = (long)local_538.p + lVar49 + lVar31 * -8 + lVar57 + 8;
                lVar49 = (long)local_538.p +
                         lVar49 + local_538.nstride * 8 + lVar31 * -8 + lVar57 + 8;
                iVar33 = (local_570.smallend.vect[1] + -1) - local_538.begin.y;
                local_650 = lVar22;
                do {
                  if (local_570.smallend.vect[0] <= local_570.bigend.vect[0]) {
                    lVar20 = lVar54 * iVar33;
                    lVar42 = iVar33 * local_538.jstride + local_570.smallend.vect[0] + lVar55;
                    lVar45 = 0;
                    do {
                      lVar41 = (long)(((local_570.smallend.vect[0] + -1) - local_538.begin.x) +
                                     (int)lVar45);
                      dVar61 = *(double *)(lVar15 + lVar45 * 8);
                      dVar67 = *(double *)
                                ((long)local_538.p +
                                lVar45 * 8 +
                                lVar20 + lVar38 + local_538.nstride * 8 + lVar31 * -8 + lVar57);
                      dVar60 = *(double *)(local_6b8 + lVar45 * 8);
                      dVar62 = *(double *)
                                ((long)local_538.p +
                                lVar45 * 8 +
                                lVar20 + lVar47 + local_538.nstride * 8 + lVar31 * -8 + lVar57);
                      dVar63 = (((*(double *)(lVar30 + lVar45 * 8) +
                                 *(double *)
                                  ((long)local_538.p +
                                  lVar45 * 8 + lVar20 + lVar16 + lVar38 + lVar31 * -8 + lVar57)) -
                                *(double *)(lVar37 + lVar45 * 8)) -
                               *(double *)
                                ((long)local_538.p +
                                lVar45 * 8 + lVar20 + lVar47 + lVar16 + lVar31 * -8 + lVar57)) *
                               local_4e0 +
                               (((*(double *)(lVar58 + lVar45 * 8) +
                                 local_538.p[(lVar42 + lVar45 + 1) - lVar31]) -
                                local_538.p
                                [(local_650 - local_538.begin.y) * local_538.jstride +
                                 lVar55 + lVar41]) -
                               local_538.p
                               [(~local_538.begin.y + (int)local_650) * local_538.jstride +
                                lVar55 + lVar41]) * local_4d0;
                      dVar64 = *(double *)(lVar28 + lVar45 * 8);
                      dVar2 = *(double *)(lVar21 + lVar45 * 8);
                      dVar68 = -*(double *)(lVar17 + lVar45 * 8);
                      *(double *)(lVar24 + lVar45 * 8) =
                           (((*(double *)(lVar49 + lVar45 * 8) +
                             local_538.p[(local_538.nstride + lVar42 + lVar45 + 1) - lVar31]) -
                            (local_538.p +
                            (local_650 - local_538.begin.y) * local_538.jstride + lVar55 + lVar41)
                            [local_538.nstride]) -
                           (local_538.p +
                           (~local_538.begin.y + (int)local_650) * local_538.jstride +
                           lVar55 + lVar41)[local_538.nstride]) * local_4d0 * dVar68;
                      *(double *)(lVar35 + lVar45 * 8) =
                           dVar63 * -0.6666666666666666 * (dVar2 - dVar64) * -0.75 - dVar63 * dVar64
                      ;
                      *(double *)(lVar19 + lVar45 * 8) =
                           dVar68 * (((dVar61 + dVar67) - dVar60) - dVar62) * local_4e0;
                      lVar45 = lVar45 + 1;
                    } while ((local_570.bigend.vect[0] - local_570.smallend.vect[0]) + 1 !=
                             (int)lVar45);
                  }
                  local_650 = local_650 + 1;
                  lVar24 = lVar24 + lVar29;
                  lVar35 = lVar35 + lVar29;
                  lVar19 = lVar19 + lVar29;
                  lVar21 = lVar21 + lVar18;
                  lVar17 = lVar17 + lVar18;
                  lVar37 = lVar37 + lVar54;
                  local_6b8 = local_6b8 + lVar54;
                  lVar30 = lVar30 + lVar54;
                  lVar15 = lVar15 + lVar54;
                  iVar33 = iVar33 + 1;
                  lVar28 = lVar28 + local_200.jstride * 8;
                  lVar58 = lVar58 + lVar54;
                  lVar49 = lVar49 + lVar54;
                } while (local_570.bigend.vect[1] + 1 != (int)local_650);
              }
              iVar26 = iVar26 + 1;
            } while (iVar26 != local_570.bigend.vect[2] + 1);
          }
          local_4c0 = local_58c.bigend.vect[2];
          local_4e8 = (ulong)(uint)local_58c.smallend.vect[2];
          if (local_58c.smallend.vect[2] <= local_58c.bigend.vect[2]) {
            local_318 = (ulong)(uint)local_58c.bigend.vect[1];
            local_450 = (long)local_58c.smallend.vect[1];
            local_310 = (long)local_58c.smallend.vect[0];
            local_320 = local_310 * 8;
            local_590 = local_58c.smallend.vect[2] - 1;
            local_4c4 = local_58c.smallend.vect[0] + -1;
            uVar11 = (local_58c.bigend.vect[0] - local_58c.smallend.vect[0]) + 1;
            local_328 = (ulong)uVar11;
            do {
              if (local_58c.smallend.vect[1] <= local_58c.bigend.vect[1]) {
                lVar16 = (long)(int)(uint)local_4e8;
                lVar24 = (long)local_538.begin.x;
                lVar49 = (long)local_448.begin.x;
                lVar17 = (lVar16 - local_448.begin.z) * local_448.kstride;
                lVar15 = (lVar16 - local_300.begin.z) * local_300.kstride;
                lVar47 = (long)(local_590 - local_538.begin.z) * local_538.kstride * 8;
                lVar37 = (lVar16 - local_538.begin.z) * local_538.kstride * 8;
                lVar55 = lVar47 + local_538.nstride * 0x10 + lVar24 * -8;
                lVar21 = local_538.nstride * 0x10 + lVar37 + lVar24 * -8;
                lVar57 = lVar47 + local_538.nstride * 8 + lVar24 * -8 + local_320;
                lVar22 = lVar37 + local_538.nstride * 8 + lVar24 * -8 + local_320;
                lVar54 = lVar55 + local_320;
                lVar58 = lVar21 + local_320;
                local_308 = local_538.jstride * 8;
                lVar31 = local_450;
                do {
                  iVar26 = (int)lVar31;
                  if (local_58c.smallend.vect[0] <= local_58c.bigend.vect[0]) {
                    lVar18 = local_538.jstride * (lVar31 - local_538.begin.y);
                    lVar19 = (lVar31 - local_300.begin.y) * local_300.jstride * 8;
                    lVar28 = (lVar31 - local_448.begin.y) * local_448.jstride * 8;
                    lVar29 = ((iVar26 + 1) - local_538.begin.y) * local_308;
                    lVar30 = (~local_538.begin.y + iVar26) * local_308;
                    lVar35 = (lVar31 - local_538.begin.y) * local_308;
                    lVar38 = 0;
                    do {
                      lVar42 = (long)((local_4c4 - local_538.begin.x) + (int)lVar38);
                      dVar61 = *(double *)((long)local_538.p + lVar38 * 8 + lVar29 + lVar58);
                      dVar67 = *(double *)((long)local_538.p + lVar38 * 8 + lVar29 + lVar54);
                      dVar60 = *(double *)((long)local_538.p + lVar38 * 8 + lVar30 + lVar58);
                      dVar62 = *(double *)((long)local_538.p + lVar38 * 8 + lVar30 + lVar54);
                      dVar63 = (((*(double *)((long)local_538.p + lVar38 * 8 + lVar29 + lVar22) +
                                 *(double *)((long)local_538.p + lVar38 * 8 + lVar29 + lVar57)) -
                                *(double *)((long)local_538.p + lVar38 * 8 + lVar30 + lVar22)) -
                               *(double *)((long)local_538.p + lVar38 * 8 + lVar30 + lVar57)) *
                               local_4d8 +
                               (((*(double *)
                                   ((long)local_538.p +
                                   lVar38 * 8 + lVar35 + lVar37 + lVar24 * -8 + 8 + local_320) +
                                 *(double *)
                                  ((long)local_538.p +
                                  lVar38 * 8 + lVar35 + lVar47 + lVar24 * -8 + 8 + local_320)) -
                                local_538.p
                                [lVar18 + lVar42 + (int)((uint)local_4e8 - local_538.begin.z) *
                                                   local_538.kstride]) -
                               local_538.p
                               [lVar18 + lVar42 + (int)(~local_538.begin.z + (uint)local_4e8) *
                                                  local_538.kstride]) * local_4d0;
                      dVar64 = *(double *)
                                ((long)local_240.p +
                                lVar38 * 8 +
                                (lVar31 - local_240.begin.y) * local_240.jstride * 8 +
                                (lVar16 - local_240.begin.z) * local_240.kstride * 8 +
                                (long)local_240.begin.x * -8 + local_320);
                      dVar2 = *(double *)
                               ((long)local_300.p +
                               lVar38 * 8 +
                               lVar19 + local_300.nstride * 0x10 + lVar15 * 8 +
                                        (long)local_300.begin.x * -8 + local_320);
                      dVar68 = -*(double *)
                                 ((long)local_300.p +
                                 lVar38 * 8 +
                                 lVar19 + lVar15 * 8 + (long)local_300.begin.x * -8 + local_320);
                      *(double *)
                       ((long)local_448.p +
                       lVar38 * 8 + lVar28 + lVar17 * 8 + lVar49 * -8 + local_320) =
                           (((*(double *)
                               ((long)local_538.p + lVar38 * 8 + lVar35 + lVar21 + 8 + local_320) +
                             *(double *)
                              ((long)local_538.p + lVar38 * 8 + lVar35 + lVar55 + local_320 + 8)) -
                            (local_538.p +
                            lVar18 + lVar42 + (int)((uint)local_4e8 - local_538.begin.z) *
                                              local_538.kstride)[local_538.nstride * 2]) -
                           (local_538.p +
                           lVar18 + lVar42 + (int)(~local_538.begin.z + (uint)local_4e8) *
                                             local_538.kstride)[local_538.nstride * 2]) * local_4d0
                           * dVar68;
                      *(double *)
                       ((long)local_448.p +
                       lVar38 * 8 +
                       lVar28 + local_448.nstride * 8 + lVar17 * 8 + lVar49 * -8 + local_320) =
                           dVar68 * (((dVar61 + dVar67) - dVar60) - dVar62) * local_4d8;
                      *(double *)
                       ((long)local_448.p +
                       lVar38 * 8 +
                       lVar28 + local_448.nstride * 0x10 + lVar17 * 8 + lVar49 * -8 + local_320) =
                           dVar63 * -0.6666666666666666 * (dVar2 - dVar64) * -0.75 - dVar63 * dVar64
                      ;
                      lVar38 = lVar38 + 1;
                    } while (uVar11 != (uint)lVar38);
                  }
                  lVar31 = lVar31 + 1;
                } while (iVar26 + 1 != local_58c.bigend.vect[1] + 1U);
              }
              uVar34 = (uint)local_4e8 + 1;
              local_590 = local_590 + 1;
              bVar59 = (uint)local_4e8 != local_58c.bigend.vect[2];
              local_4e8 = (ulong)uVar34;
            } while (bVar59);
          }
        }
        else {
          MultiCutFab::const_array(&local_a0,local_388,(MFIter *)&local_180);
          MultiCutFab::const_array(&local_e0,pMStack_380,(MFIter *)&local_180);
          MultiCutFab::const_array(&local_120,local_378,(MFIter *)&local_180);
          FabArray<amrex::EBCellFlagFab>::const_array<amrex::EBCellFlagFab,_0>
                    (&local_3c8,local_4f8,(MFIter *)&local_180);
          if (local_554.smallend.vect[2] <= local_554.bigend.vect[2]) {
            lVar22 = (long)local_554.smallend.vect[0];
            lVar57 = lVar22 * 8;
            iVar26 = local_554.smallend.vect[2];
            do {
              if (local_554.smallend.vect[1] <= local_554.bigend.vect[1]) {
                lVar54 = (long)iVar26;
                lVar58 = (long)local_a0.p +
                         ((long)local_554.smallend.vect[1] - (long)local_a0.begin.y) *
                         local_a0.jstride * 8 + (lVar54 - local_a0.begin.z) * local_a0.kstride * 8 +
                         (long)local_a0.begin.x * -8 + lVar57;
                local_6c0 = (long)local_554.smallend.vect[1];
                do {
                  if (local_554.smallend.vect[0] <= local_554.bigend.vect[0]) {
                    lVar31 = (long)local_538.begin.x;
                    lVar15 = (long)local_538.begin.y;
                    lVar16 = (long)local_498;
                    lVar28 = (local_6c0 - local_494) * CONCAT44(local_4b8._12_4_,local_4b8._8_4_);
                    lVar42 = (lVar54 - local_490) * CONCAT44(local_4b8._20_4_,local_4b8._16_4_);
                    lVar24 = CONCAT44(uStack_49c,local_4b8._24_4_);
                    lVar17 = (local_6c0 - local_3c8.begin.y) * local_3c8.jstride;
                    lVar29 = (lVar54 - local_3c8.begin.z) * local_3c8.kstride;
                    lVar18 = local_538.jstride * 8;
                    lVar35 = local_538.kstride * 8;
                    lVar37 = (lVar54 - local_538.begin.z) * lVar35;
                    lVar55 = (local_6c0 - lVar15) * lVar18;
                    lVar21 = lVar37 + local_538.nstride * 8 + lVar31 * -8 + lVar57;
                    lVar37 = lVar37 + lVar31 * -8 + lVar57;
                    lVar47 = local_538.nstride * 0x10 + lVar55 + lVar31 * -8 + lVar57;
                    lVar55 = lVar55 + lVar31 * -8 + lVar57;
                    lVar30 = (local_6c0 - local_280.begin.y) * local_280.jstride;
                    lVar38 = (lVar54 - local_280.begin.z) * local_280.kstride;
                    iVar33 = (int)local_6c0;
                    lVar19 = -lVar15;
                    lVar31 = -(long)local_538.begin.z;
                    lVar45 = 0;
                    lVar49 = lVar22;
                    do {
                      dVar61 = *(double *)(lVar58 + lVar45 * 8);
                      if ((dVar61 != 0.0) || (NAN(dVar61))) {
                        uVar11 = local_3c8.p
                                 [lVar22 + ((lVar17 + lVar29 + lVar45) - (long)local_3c8.begin.x)].
                                 flag;
                        uVar34 = uVar11 >> 0x15 & 1;
                        iVar36 = (int)(short)uVar11 >> 0xf;
                        iVar27 = uVar34 - iVar36;
                        dVar61 = 1.0;
                        if (iVar27 != 1) {
                          dVar61 = 0.0;
                        }
                        dVar67 = 0.5;
                        if (iVar27 != 2) {
                          dVar67 = dVar61;
                        }
                        uVar53 = local_3c8.p
                                 [lVar22 + ((lVar17 + lVar29 + lVar45 + -1) -
                                           (long)local_3c8.begin.x)].flag;
                        uVar44 = uVar53 >> 0x15 & 1;
                        iVar56 = (int)(short)uVar53 >> 0xf;
                        iVar27 = uVar44 - iVar56;
                        dVar61 = 1.0;
                        if (iVar27 != 1) {
                          dVar61 = 0.0;
                        }
                        dVar60 = 0.5;
                        if (iVar27 != 2) {
                          dVar60 = dVar61;
                        }
                        uVar50 = uVar11 >> 0x1b & 1;
                        iVar48 = (int)(uVar11 << 0x16) >> 0x1f;
                        iVar27 = uVar50 - iVar48;
                        dVar61 = 1.0;
                        if (iVar27 != 1) {
                          dVar61 = 0.0;
                        }
                        dVar62 = 0.5;
                        if (iVar27 != 2) {
                          dVar62 = dVar61;
                        }
                        uVar11 = uVar53 >> 0x1b & 1;
                        iVar25 = (int)(uVar53 << 0x16) >> 0x1f;
                        iVar27 = uVar11 - iVar25;
                        dVar61 = 1.0;
                        if (iVar27 != 1) {
                          dVar61 = 0.0;
                        }
                        dVar64 = 0.5;
                        if (iVar27 != 2) {
                          dVar64 = dVar61;
                        }
                        lVar51 = ((ulong)uVar34 + (iVar33 - lVar15)) * lVar18;
                        dVar61 = *(double *)((long)local_538.p + lVar45 * 8 + lVar51 + lVar37);
                        lVar20 = ((iVar36 + iVar33) + lVar19) * lVar18;
                        dVar2 = *(double *)((long)local_538.p + lVar45 * 8 + lVar20 + lVar37);
                        lVar39 = ((int)(uVar44 + iVar33) + lVar19) * lVar18;
                        dVar63 = *(double *)((long)local_538.p + lVar45 * 8 + lVar39 + lVar37 + -8);
                        lVar46 = ((iVar56 + iVar33) + lVar19) * lVar18;
                        dVar68 = *(double *)((long)local_538.p + lVar45 * 8 + lVar46 + lVar37 + -8);
                        lVar41 = ((int)(uVar50 + iVar26) + lVar31) * lVar35;
                        dVar3 = *(double *)((long)local_538.p + lVar45 * 8 + lVar41 + lVar55);
                        lVar40 = ((iVar48 + iVar26) + lVar31) * lVar35;
                        dVar65 = *(double *)((long)local_538.p + lVar45 * 8 + lVar40 + lVar55);
                        lVar43 = ((int)(uVar11 + iVar26) + lVar31) * lVar35;
                        dVar66 = *(double *)((long)local_538.p + lVar45 * 8 + lVar43 + lVar55 + -8);
                        lVar23 = ((iVar25 + iVar26) + lVar31) * lVar35;
                        dVar69 = *(double *)((long)local_538.p + lVar45 * 8 + lVar23 + lVar55 + -8);
                        dVar70 = ((*(double *)((long)local_538.p + lVar45 * 8 + lVar41 + lVar47) -
                                  *(double *)((long)local_538.p + lVar45 * 8 + lVar40 + lVar47)) *
                                  dVar62 + (*(double *)
                                             ((long)local_538.p + lVar45 * 8 + lVar43 + lVar47 + -8)
                                           - *(double *)
                                              ((long)local_538.p + lVar45 * 8 + lVar23 + lVar47 + -8
                                              )) * dVar64) * local_358 +
                                 ((*(double *)((long)local_538.p + lVar45 * 8 + lVar51 + lVar21) -
                                  *(double *)((long)local_538.p + lVar45 * 8 + lVar20 + lVar21)) *
                                  dVar67 + (*(double *)
                                             ((long)local_538.p + lVar45 * 8 + lVar39 + lVar21 + -8)
                                           - *(double *)
                                              ((long)local_538.p + lVar45 * 8 + lVar46 + lVar21 + -8
                                              )) * dVar60) * local_350;
                        lVar20 = (lVar22 - lVar16) + lVar45;
                        dVar1 = local_280.p
                                [lVar22 + ((local_280.nstride + lVar30 + lVar38 + lVar45) -
                                          (long)local_280.begin.x)];
                        *(double *)
                         (local_4b8._0_8_ + (lVar22 + ((lVar28 + lVar42 + lVar45) - lVar16)) * 8) =
                             dVar70 * -0.6666666666666666 *
                             (local_280.p
                              [lVar22 + ((lVar30 + lVar38 + lVar45) - (long)local_280.begin.x)] -
                             local_1c0.p
                             [lVar22 + (((local_6c0 - local_1c0.begin.y) * local_1c0.jstride +
                                        (lVar54 - local_1c0.begin.z) * local_1c0.kstride + lVar45) -
                                       (long)local_1c0.begin.x)]) * -0.75 -
                             dVar70 * local_1c0.p
                                      [lVar22 + (((local_6c0 - local_1c0.begin.y) *
                                                  local_1c0.jstride +
                                                 (lVar54 - local_1c0.begin.z) * local_1c0.kstride +
                                                 lVar45) - (long)local_1c0.begin.x)];
                        *(double *)
                         (local_4b8._0_8_ +
                         (lVar22 + ((lVar24 + lVar28 + lVar42 + lVar45) - lVar16)) * 8) =
                             ((dVar61 - dVar2) * dVar67 + (dVar63 - dVar68) * dVar60) * local_350 *
                             -dVar1;
                        dVar61 = -dVar1 * ((dVar3 - dVar65) * dVar62 + (dVar66 - dVar69) * dVar64) *
                                          local_358;
                      }
                      else {
                        lVar20 = lVar49 - lVar16;
                        *(double *)
                         (local_4b8._0_8_ + (lVar22 + ((lVar28 + lVar42 + lVar45) - lVar16)) * 8) =
                             0.0;
                        *(double *)
                         (local_4b8._0_8_ +
                         (lVar22 + ((lVar24 + lVar28 + lVar42 + lVar45) - lVar16)) * 8) = 0.0;
                        dVar61 = 0.0;
                      }
                      *(double *)(local_4b8._0_8_ + (lVar24 * 2 + lVar28 + lVar42 + lVar20) * 8) =
                           dVar61;
                      lVar49 = lVar49 + 1;
                      lVar45 = lVar45 + 1;
                    } while ((local_554.bigend.vect[0] - local_554.smallend.vect[0]) + 1 !=
                             (int)lVar45);
                  }
                  local_6c0 = local_6c0 + 1;
                  lVar58 = lVar58 + local_a0.jstride * 8;
                } while (local_554.bigend.vect[1] + 1 != (int)local_6c0);
              }
              bVar59 = iVar26 != local_554.bigend.vect[2];
              iVar26 = iVar26 + 1;
            } while (bVar59);
          }
          if (local_570.smallend.vect[2] <= local_570.bigend.vect[2]) {
            lVar22 = (long)local_570.smallend.vect[1];
            lVar54 = (long)local_570.smallend.vect[0];
            lVar57 = lVar54 * 8;
            iVar26 = local_570.smallend.vect[2];
            do {
              if (local_570.smallend.vect[1] <= local_570.bigend.vect[1]) {
                lVar58 = (long)iVar26;
                lVar31 = (long)local_e0.p +
                         (lVar22 - local_e0.begin.y) * local_e0.jstride * 8 +
                         (lVar58 - local_e0.begin.z) * local_e0.kstride * 8 +
                         (long)local_e0.begin.x * -8 + lVar57;
                local_6a0 = lVar22;
                local_688 = lVar22 + -1;
                do {
                  if (local_570.smallend.vect[0] <= local_570.bigend.vect[0]) {
                    lVar35 = local_6a0 - local_538.begin.y;
                    lVar30 = (lVar58 - local_538.begin.z) * local_538.kstride;
                    lVar16 = (lVar35 + -1) * local_538.jstride;
                    lVar15 = (long)local_408.begin.x;
                    lVar28 = (local_6a0 - local_408.begin.y) * local_408.jstride;
                    lVar42 = (lVar58 - local_408.begin.z) * local_408.kstride;
                    lVar38 = (local_6a0 - local_2c0.begin.y) * local_2c0.jstride;
                    lVar17 = (lVar58 - local_2c0.begin.z) * local_2c0.kstride;
                    lVar55 = (long)local_538.begin.x;
                    lVar37 = lVar35 * local_538.jstride * 8;
                    lVar24 = (local_688 - local_538.begin.y) * local_538.jstride * 8;
                    lVar21 = lVar37 + local_538.nstride * 0x10 + lVar55 * -8 + lVar57;
                    lVar37 = lVar37 + local_538.nstride * 8 + lVar55 * -8 + lVar57;
                    lVar47 = local_538.nstride * 0x10 + lVar24 + lVar55 * -8 + lVar57;
                    lVar55 = lVar24 + local_538.nstride * 8 + lVar55 * -8 + lVar57;
                    lVar18 = (lVar58 - local_3c8.begin.z) * local_3c8.kstride;
                    lVar29 = local_538.kstride * 8;
                    lVar24 = -(long)local_538.begin.z;
                    lVar19 = 0;
                    lVar49 = lVar54;
                    do {
                      dVar67 = 1.0;
                      dVar61 = *(double *)(lVar31 + lVar19 * 8);
                      if ((dVar61 != 0.0) || (NAN(dVar61))) {
                        uVar11 = *(uint32_t *)
                                  ((long)&local_3c8.p
                                          [lVar54 + ((lVar18 + lVar19) - (long)local_3c8.begin.x)].
                                          flag +
                                  (local_6a0 - local_3c8.begin.y) * local_3c8.jstride * 4);
                        uVar34 = uVar11 >> 0x13 & 1;
                        iVar36 = (int)(uVar11 << 0xe) >> 0x1f;
                        iVar33 = uVar34 - iVar36;
                        dVar61 = 1.0;
                        if (iVar33 != 1) {
                          dVar61 = 0.0;
                        }
                        dVar60 = 0.5;
                        if (iVar33 != 2) {
                          dVar60 = dVar61;
                        }
                        uVar53 = *(uint32_t *)
                                  ((long)&local_3c8.p
                                          [lVar54 + ((lVar18 + lVar19) - (long)local_3c8.begin.x)].
                                          flag +
                                  (local_688 - local_3c8.begin.y) * local_3c8.jstride * 4);
                        uVar44 = uVar53 >> 0x13 & 1;
                        iVar33 = (int)(uVar53 << 0xe) >> 0x1f;
                        iVar27 = uVar44 - iVar33;
                        dVar61 = 1.0;
                        if (iVar27 != 1) {
                          dVar61 = 0.0;
                        }
                        dVar62 = 0.5;
                        if (iVar27 != 2) {
                          dVar62 = dVar61;
                        }
                        uVar50 = uVar11 >> 0x1b & 1;
                        iVar27 = (int)(uVar11 << 0x16) >> 0x1f;
                        iVar56 = uVar50 - iVar27;
                        dVar61 = 1.0;
                        if (iVar56 != 1) {
                          dVar61 = 0.0;
                        }
                        dVar64 = 0.5;
                        if (iVar56 != 2) {
                          dVar64 = dVar61;
                        }
                        uVar11 = uVar53 >> 0x1b & 1;
                        iVar48 = (int)(uVar53 << 0x16) >> 0x1f;
                        iVar56 = uVar11 - iVar48;
                        if (iVar56 != 1) {
                          dVar67 = 0.0;
                        }
                        dVar61 = 0.5;
                        if (iVar56 != 2) {
                          dVar61 = dVar67;
                        }
                        iVar56 = (local_570.smallend.vect[0] - local_538.begin.x) + (int)lVar19;
                        lVar45 = ((int)(uVar50 + iVar26) + lVar24) * lVar29;
                        dVar67 = *(double *)((long)local_538.p + lVar19 * 8 + lVar45 + lVar37);
                        lVar20 = ((iVar27 + iVar26) + lVar24) * lVar29;
                        dVar2 = *(double *)((long)local_538.p + lVar19 * 8 + lVar20 + lVar37);
                        lVar46 = ((int)(uVar11 + iVar26) + lVar24) * lVar29;
                        dVar63 = *(double *)((long)local_538.p + lVar19 * 8 + lVar46 + lVar55);
                        lVar41 = ((iVar48 + iVar26) + lVar24) * lVar29;
                        dVar68 = *(double *)((long)local_538.p + lVar19 * 8 + lVar41 + lVar55);
                        dVar69 = ((*(double *)((long)local_538.p + lVar19 * 8 + lVar45 + lVar21) -
                                  *(double *)((long)local_538.p + lVar19 * 8 + lVar20 + lVar21)) *
                                  dVar64 + (*(double *)
                                             ((long)local_538.p + lVar19 * 8 + lVar46 + lVar47) -
                                           *(double *)
                                            ((long)local_538.p + lVar19 * 8 + lVar41 + lVar47)) *
                                           dVar61) * local_358 +
                                 ((local_538.p
                                   [local_538.jstride * lVar35 + lVar30 + (int)(uVar34 + iVar56)] -
                                  local_538.p
                                  [local_538.jstride * lVar35 + lVar30 + (iVar36 + iVar56)]) *
                                  dVar60 + (local_538.p[lVar16 + lVar30 + (int)(uVar44 + iVar56)] -
                                           local_538.p[lVar16 + lVar30 + (iVar33 + iVar56)]) *
                                           dVar62) * local_360;
                        dVar3 = local_200.p
                                [lVar54 + (((local_6a0 - local_200.begin.y) * local_200.jstride +
                                           (lVar58 - local_200.begin.z) * local_200.kstride + lVar19
                                           ) - (long)local_200.begin.x)];
                        dVar65 = local_2c0.p
                                 [lVar54 + ((local_2c0.nstride + lVar38 + lVar17 + lVar19) -
                                           (long)local_2c0.begin.x)];
                        dVar66 = local_2c0.p
                                 [lVar54 + ((lVar38 + lVar17 + lVar19) - (long)local_2c0.begin.x)];
                        lVar45 = (lVar54 - lVar15) + lVar19;
                        local_408.p[lVar54 + ((lVar28 + lVar42 + lVar19) - lVar15)] =
                             (((local_538.p +
                               local_538.jstride * lVar35 + lVar30 + (int)(uVar34 + iVar56))
                               [local_538.nstride] -
                              (local_538.p + local_538.jstride * lVar35 + lVar30 + (iVar36 + iVar56)
                              )[local_538.nstride]) * dVar60 +
                             ((local_538.p + lVar16 + lVar30 + (int)(uVar44 + iVar56))
                              [local_538.nstride] -
                             (local_538.p + lVar16 + lVar30 + (iVar33 + iVar56))[local_538.nstride])
                             * dVar62) * local_360 * -dVar66;
                        local_408.p
                        [lVar54 + ((local_408.nstride + lVar28 + lVar42 + lVar19) - lVar15)] =
                             dVar69 * -0.6666666666666666 * (dVar65 - dVar3) * -0.75 -
                             dVar69 * dVar3;
                        dVar61 = -dVar66 * ((dVar67 - dVar2) * dVar64 + (dVar63 - dVar68) * dVar61)
                                           * local_358;
                      }
                      else {
                        lVar45 = lVar49 - lVar15;
                        local_408.p[lVar54 + ((lVar28 + lVar42 + lVar19) - lVar15)] = 0.0;
                        local_408.p
                        [lVar54 + ((local_408.nstride + lVar28 + lVar42 + lVar19) - lVar15)] = 0.0;
                        dVar61 = 0.0;
                      }
                      local_408.p[local_408.nstride * 2 + lVar28 + lVar42 + lVar45] = dVar61;
                      lVar49 = lVar49 + 1;
                      lVar19 = lVar19 + 1;
                    } while ((local_570.bigend.vect[0] - local_570.smallend.vect[0]) + 1 !=
                             (int)lVar19);
                  }
                  local_6a0 = local_6a0 + 1;
                  local_688 = local_688 + 1;
                  lVar31 = lVar31 + local_e0.jstride * 8;
                } while (local_570.bigend.vect[1] + 1 != (int)local_6a0);
              }
              bVar59 = iVar26 != local_570.bigend.vect[2];
              iVar26 = iVar26 + 1;
            } while (bVar59);
          }
          if (local_58c.smallend.vect[2] <= local_58c.bigend.vect[2]) {
            lVar22 = (long)local_58c.smallend.vect[0];
            lVar57 = lVar22 * 8;
            iVar26 = local_58c.smallend.vect[2] - 1;
            uVar11 = local_58c.smallend.vect[2];
            do {
              if (local_58c.smallend.vect[1] <= local_58c.bigend.vect[1]) {
                lVar58 = (long)(int)uVar11;
                lVar31 = (long)local_120.p +
                         ((long)local_58c.smallend.vect[1] - (long)local_120.begin.y) *
                         local_120.jstride * 8 +
                         (lVar58 - local_120.begin.z) * local_120.kstride * 8 +
                         (long)local_120.begin.x * -8 + lVar57;
                lVar54 = (long)local_58c.smallend.vect[1];
                do {
                  if (local_58c.smallend.vect[0] <= local_58c.bigend.vect[0]) {
                    lVar15 = (lVar54 - local_538.begin.y) * local_538.jstride;
                    lVar28 = (int)(uVar11 - local_538.begin.z) * local_538.kstride;
                    lVar29 = (int)((uVar11 - 1) - local_538.begin.z) * local_538.kstride;
                    lVar18 = (long)local_448.begin.x;
                    lVar16 = (lVar54 - local_448.begin.y) * local_448.jstride;
                    lVar42 = (lVar58 - local_448.begin.z) * local_448.kstride;
                    lVar35 = (lVar54 - local_300.begin.y) * local_300.jstride;
                    lVar30 = (lVar58 - local_300.begin.z) * local_300.kstride;
                    lVar37 = (lVar58 - local_538.begin.z) * local_538.kstride * 8;
                    lVar55 = ((long)iVar26 - (long)local_538.begin.z) * local_538.kstride * 8;
                    lVar24 = (long)local_538.begin.x;
                    lVar21 = lVar37 + local_538.nstride * 0x10 + lVar24 * -8 + lVar57;
                    lVar37 = lVar37 + local_538.nstride * 8 + lVar24 * -8 + lVar57;
                    lVar47 = local_538.nstride * 0x10 + lVar55 + lVar24 * -8 + lVar57;
                    lVar55 = lVar55 + local_538.nstride * 8 + lVar24 * -8 + lVar57;
                    lVar19 = (lVar54 - local_3c8.begin.y) * local_3c8.jstride;
                    lVar38 = local_538.jstride * 8;
                    lVar24 = -(long)local_538.begin.y;
                    lVar17 = 0;
                    lVar49 = lVar22;
                    do {
                      dVar67 = 1.0;
                      dVar61 = *(double *)(lVar31 + lVar17 * 8);
                      if ((dVar61 != 0.0) || (NAN(dVar61))) {
                        uVar34 = *(uint32_t *)
                                  ((long)&local_3c8.p
                                          [lVar22 + ((lVar19 + lVar17) - (long)local_3c8.begin.x)].
                                          flag +
                                  (lVar58 - local_3c8.begin.z) * local_3c8.kstride * 4);
                        uVar53 = uVar34 >> 0x13 & 1;
                        iVar36 = (int)(uVar34 << 0xe) >> 0x1f;
                        iVar33 = uVar53 - iVar36;
                        dVar61 = 1.0;
                        if (iVar33 != 1) {
                          dVar61 = 0.0;
                        }
                        dVar60 = 0.5;
                        if (iVar33 != 2) {
                          dVar60 = dVar61;
                        }
                        uVar44 = *(uint32_t *)
                                  ((long)&local_3c8.p
                                          [lVar22 + ((lVar19 + lVar17) - (long)local_3c8.begin.x)].
                                          flag +
                                  ((long)iVar26 - (long)local_3c8.begin.z) * local_3c8.kstride * 4);
                        uVar50 = uVar44 >> 0x13 & 1;
                        iVar27 = (int)(uVar44 << 0xe) >> 0x1f;
                        iVar33 = uVar50 - iVar27;
                        dVar61 = 1.0;
                        if (iVar33 != 1) {
                          dVar61 = 0.0;
                        }
                        dVar62 = 0.5;
                        if (iVar33 != 2) {
                          dVar62 = dVar61;
                        }
                        uVar12 = uVar34 >> 0x15 & 1;
                        iVar56 = (int)(short)uVar34 >> 0xf;
                        iVar33 = uVar12 - iVar56;
                        dVar61 = 1.0;
                        if (iVar33 != 1) {
                          dVar61 = 0.0;
                        }
                        dVar64 = 0.5;
                        if (iVar33 != 2) {
                          dVar64 = dVar61;
                        }
                        uVar34 = uVar44 >> 0x15 & 1;
                        iVar48 = (int)(short)uVar44 >> 0xf;
                        iVar33 = uVar34 - iVar48;
                        if (iVar33 != 1) {
                          dVar67 = 0.0;
                        }
                        dVar61 = 0.5;
                        if (iVar33 != 2) {
                          dVar61 = dVar67;
                        }
                        iVar25 = (local_58c.smallend.vect[0] - local_538.begin.x) + (int)lVar17;
                        iVar33 = (int)lVar54;
                        lVar45 = ((int)(uVar12 + iVar33) + lVar24) * lVar38;
                        lVar41 = ((iVar56 + iVar33) + lVar24) * lVar38;
                        lVar46 = ((int)(uVar34 + iVar33) + lVar24) * lVar38;
                        lVar20 = ((iVar48 + iVar33) + lVar24) * lVar38;
                        dVar67 = *(double *)((long)local_538.p + lVar17 * 8 + lVar45 + lVar21);
                        dVar2 = *(double *)((long)local_538.p + lVar17 * 8 + lVar41 + lVar21);
                        dVar63 = *(double *)((long)local_538.p + lVar17 * 8 + lVar46 + lVar47);
                        dVar69 = ((*(double *)((long)local_538.p + lVar17 * 8 + lVar45 + lVar37) -
                                  *(double *)((long)local_538.p + lVar17 * 8 + lVar41 + lVar37)) *
                                  dVar64 + (*(double *)
                                             ((long)local_538.p + lVar17 * 8 + lVar46 + lVar55) -
                                           *(double *)
                                            ((long)local_538.p + lVar17 * 8 + lVar20 + lVar55)) *
                                           dVar61) * local_350 +
                                 ((local_538.p[lVar15 + lVar28 + (int)(uVar53 + iVar25)] -
                                  local_538.p[lVar15 + lVar28 + (iVar36 + iVar25)]) * dVar60 +
                                 (local_538.p[lVar15 + lVar29 + (int)(uVar50 + iVar25)] -
                                 local_538.p[lVar15 + lVar29 + (iVar27 + iVar25)]) * dVar62) *
                                 local_360;
                        dVar68 = *(double *)((long)local_538.p + lVar17 * 8 + lVar20 + lVar47);
                        dVar3 = local_240.p
                                [lVar22 + (((lVar54 - local_240.begin.y) * local_240.jstride +
                                           (lVar58 - local_240.begin.z) * local_240.kstride + lVar17
                                           ) - (long)local_240.begin.x)];
                        dVar65 = local_300.p
                                 [lVar22 + ((lVar35 + lVar30 + local_300.nstride * 2 + lVar17) -
                                           (long)local_300.begin.x)];
                        dVar66 = local_300.p
                                 [lVar22 + ((lVar35 + lVar30 + lVar17) - (long)local_300.begin.x)];
                        lVar45 = (lVar22 - lVar18) + lVar17;
                        local_448.p[lVar22 + ((lVar16 + lVar42 + lVar17) - lVar18)] =
                             (((local_538.p + lVar15 + lVar28 + (int)(uVar53 + iVar25))
                               [local_538.nstride * 2] -
                              (local_538.p + lVar15 + lVar28 + (iVar36 + iVar25))
                              [local_538.nstride * 2]) * dVar60 +
                             ((local_538.p + lVar15 + lVar29 + (int)(uVar50 + iVar25))
                              [local_538.nstride * 2] -
                             (local_538.p + lVar15 + lVar29 + (iVar27 + iVar25))
                             [local_538.nstride * 2]) * dVar62) * local_360 * -dVar66;
                        local_448.p
                        [lVar22 + ((local_448.nstride + lVar16 + lVar42 + lVar17) - lVar18)] =
                             -dVar66 * ((dVar67 - dVar2) * dVar64 + (dVar63 - dVar68) * dVar61) *
                                       local_350;
                        dVar61 = dVar69 * -0.6666666666666666 * (dVar65 - dVar3) * -0.75 -
                                 dVar69 * dVar3;
                      }
                      else {
                        lVar45 = lVar49 - lVar18;
                        local_448.p[lVar22 + ((lVar16 + lVar42 + lVar17) - lVar18)] = 0.0;
                        local_448.p
                        [lVar22 + ((local_448.nstride + lVar16 + lVar42 + lVar17) - lVar18)] = 0.0;
                        dVar61 = 0.0;
                      }
                      local_448.p[local_448.nstride * 2 + lVar16 + lVar42 + lVar45] = dVar61;
                      lVar49 = lVar49 + 1;
                      lVar17 = lVar17 + 1;
                    } while ((local_58c.bigend.vect[0] - local_58c.smallend.vect[0]) + 1 !=
                             (int)lVar17);
                  }
                  lVar54 = lVar54 + 1;
                  lVar31 = lVar31 + local_120.jstride * 8;
                } while (local_58c.bigend.vect[1] + 1U != (int)lVar54);
              }
              iVar26 = iVar26 + 1;
              bVar59 = uVar11 != local_58c.bigend.vect[2];
              uVar11 = uVar11 + 1;
            } while (bVar59);
          }
        }
      }
      else {
        piVar14 = local_160;
        if (local_140 != (Vector<int,_std::allocator<int>_> *)0x0) {
          piVar14 = (local_140->super_vector<int,_std::allocator<int>_>).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start + local_160[0];
        }
        local_4b8._20_4_ = local_60.bigend.vect[2];
        local_4b8._24_4_ = local_60.btype.itype;
        local_4b8._0_4_ = local_60.smallend.vect[0];
        local_4b8._4_4_ = local_60.smallend.vect[1];
        local_4b8._8_4_ = local_60.smallend.vect[2] + -1;
        local_4b8._12_4_ = local_60.bigend.vect[0] + 1;
        local_4b8._4_4_ = local_4b8._4_4_ + -1;
        local_4b8._0_4_ = local_4b8._0_4_ + -1;
        local_4b8._16_4_ = local_60.bigend.vect[1] + 1;
        local_4b8._20_4_ = local_4b8._20_4_ + 1;
        FVar10 = EBCellFlagFab::getType
                           ((local_4f8->m_fabs_v).
                            super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                            ._M_impl.super__Vector_impl_data._M_start[*piVar14],(Box *)local_4b8);
        if (FVar10 != covered) goto LAB_0060a287;
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((Array4<double> *)local_4b8,local_4f0,(MFIter *)&local_180);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&local_408,local_458,(MFIter *)&local_180);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&local_448,local_460,(MFIter *)&local_180);
        iVar48 = local_554.bigend.vect[2];
        iVar56 = local_554.bigend.vect[1];
        iVar27 = local_554.bigend.vect[0];
        iVar36 = local_554.smallend.vect[2];
        iVar33 = local_554.smallend.vect[1];
        iVar26 = local_554.smallend.vect[0];
        lVar54 = (long)local_554.smallend.vect[0];
        lVar22 = (long)local_554.smallend.vect[1];
        uVar11 = local_554.bigend.vect[0] - local_554.smallend.vect[0];
        iVar25 = local_554.bigend.vect[1] - local_554.smallend.vect[1];
        local_6b8 = 0;
        lVar57 = 0;
        do {
          local_6d8 = iVar36;
          if (iVar36 <= iVar48) {
            do {
              if (iVar33 <= iVar56) {
                lVar58 = CONCAT44(local_4b8._12_4_,local_4b8._8_4_) * 8;
                pvVar52 = (void *)(local_4b8._0_8_ +
                                  CONCAT44(uStack_49c,local_4b8._24_4_) * local_6b8 +
                                  (lVar22 - local_494) * lVar58 +
                                  (long)(local_6d8 - local_490) *
                                  CONCAT44(local_4b8._20_4_,local_4b8._16_4_) * 8 +
                                  (long)local_498 * -8 + lVar54 * 8);
                iVar32 = iVar25 + 1;
                do {
                  if (iVar26 <= iVar27) {
                    memset(pvVar52,0,(ulong)uVar11 * 8 + 8);
                  }
                  pvVar52 = (void *)((long)pvVar52 + lVar58);
                  iVar32 = iVar32 + -1;
                } while (iVar32 != 0);
              }
              bVar59 = local_6d8 != iVar48;
              local_6d8 = local_6d8 + 1;
            } while (bVar59);
          }
          iVar9 = local_570.bigend.vect[2];
          iVar8 = local_570.bigend.vect[1];
          iVar7 = local_570.bigend.vect[0];
          iVar6 = local_570.smallend.vect[2];
          iVar5 = local_570.smallend.vect[1];
          iVar32 = local_570.smallend.vect[0];
          lVar57 = lVar57 + 1;
          local_6b8 = local_6b8 + 8;
        } while (lVar57 != 3);
        lVar54 = (long)local_570.smallend.vect[0];
        lVar22 = (long)local_570.smallend.vect[1];
        uVar11 = local_570.bigend.vect[0] - local_570.smallend.vect[0];
        iVar26 = local_570.bigend.vect[1] - local_570.smallend.vect[1];
        local_6b8 = 0;
        lVar57 = 0;
        do {
          local_6d8 = iVar6;
          if (iVar6 <= iVar9) {
            do {
              if (iVar5 <= iVar8) {
                lVar58 = local_408.jstride * 8;
                pvVar52 = (void *)((long)local_408.p +
                                  local_408.nstride * local_6b8 +
                                  (lVar22 - local_408.begin.y) * lVar58 +
                                  (local_6d8 - local_408.begin.z) * local_408.kstride * 8 +
                                  (long)local_408.begin.x * -8 + lVar54 * 8);
                iVar33 = iVar26 + 1;
                do {
                  if (iVar32 <= iVar7) {
                    memset(pvVar52,0,(ulong)uVar11 * 8 + 8);
                  }
                  pvVar52 = (void *)((long)pvVar52 + lVar58);
                  iVar33 = iVar33 + -1;
                } while (iVar33 != 0);
              }
              bVar59 = local_6d8 != iVar9;
              local_6d8 = local_6d8 + 1;
            } while (bVar59);
          }
          iVar25 = local_58c.bigend.vect[2];
          iVar48 = local_58c.bigend.vect[1];
          iVar56 = local_58c.bigend.vect[0];
          iVar27 = local_58c.smallend.vect[2];
          iVar36 = local_58c.smallend.vect[1];
          iVar33 = local_58c.smallend.vect[0];
          lVar57 = lVar57 + 1;
          local_6b8 = local_6b8 + 8;
        } while (lVar57 != 3);
        lVar54 = (long)local_58c.smallend.vect[0];
        lVar22 = (long)local_58c.smallend.vect[1];
        uVar11 = local_58c.bigend.vect[0] - local_58c.smallend.vect[0];
        iVar26 = local_58c.bigend.vect[1] - local_58c.smallend.vect[1];
        local_6b8 = 0;
        lVar57 = 0;
        do {
          uVar34 = iVar27;
          if (iVar27 <= iVar25) {
            do {
              if (iVar36 <= iVar48) {
                lVar58 = local_448.jstride * 8;
                pvVar52 = (void *)((long)local_448.p +
                                  local_448.nstride * local_6b8 +
                                  (lVar22 - local_448.begin.y) * lVar58 +
                                  (int)(uVar34 - local_448.begin.z) * local_448.kstride * 8 +
                                  (long)local_448.begin.x * -8 + lVar54 * 8);
                iVar32 = iVar26 + 1;
                do {
                  if (iVar33 <= iVar56) {
                    memset(pvVar52,0,(ulong)uVar11 * 8 + 8);
                  }
                  pvVar52 = (void *)((long)pvVar52 + lVar58);
                  iVar32 = iVar32 + -1;
                } while (iVar32 != 0);
              }
              bVar59 = uVar34 != iVar25;
              uVar34 = uVar34 + 1;
            } while (bVar59);
          }
          lVar57 = lVar57 + 1;
          local_6b8 = local_6b8 + 8;
        } while (lVar57 != 3);
      }
      MFIter::operator++((MFIter *)&local_180);
    } while (local_160[0] < local_158);
  }
  this_00 = (Geometry *)(lVar13 + local_368);
  MFIter::~MFIter((MFIter *)&local_180);
  lVar13 = 0;
  do {
    pFVar4 = &local_4f0->super_FabArrayBase;
    local_180.vect = (int  [3])Geometry::periodicity(this_00);
    FabArray<amrex::FArrayBox>::FillBoundary<double>
              ((FabArray<amrex::FArrayBox> *)((long)&pFVar4->_vptr_FabArrayBase + lVar13),0,3,
               (Periodicity *)&local_180,false);
    lVar13 = lVar13 + 0x180;
  } while (lVar13 != 0x480);
  return;
}

Assistant:

void
MLEBTensorOp::compCrossTerms(int amrlev, int mglev, MultiFab const& mf) const
{
    auto factory = dynamic_cast<EBFArrayBoxFactory const*>(m_factory[amrlev][mglev].get());
    const FabArray<EBCellFlagFab>* flags = (factory) ? &(factory->getMultiEBCellFlagFab()) : nullptr;
    auto area = (factory) ? factory->getAreaFrac()
        : Array<const MultiCutFab*,AMREX_SPACEDIM>{AMREX_D_DECL(nullptr,nullptr,nullptr)};

    const Geometry& geom = m_geom[amrlev][mglev];
    const auto dxinv = geom.InvCellSizeArray();

    Array<MultiFab,AMREX_SPACEDIM> const& etamf = m_b_coeffs[amrlev][mglev];
    Array<MultiFab,AMREX_SPACEDIM> const& kapmf = m_kappa[amrlev][mglev];
    Array<MultiFab,AMREX_SPACEDIM>& fluxmf = m_tauflux[amrlev][mglev];

    MFItInfo mfi_info;
    if (Gpu::notInLaunchRegion()) mfi_info.EnableTiling().SetDynamic(true);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(mf, mfi_info); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.tilebox();
        AMREX_D_TERM(Box const xbx = mfi.nodaltilebox(0);,
                     Box const ybx = mfi.nodaltilebox(1);,
                     Box const zbx = mfi.nodaltilebox(2););

        // grow by 1 because of corners
        auto fabtyp = (flags) ? (*flags)[mfi].getType(amrex::grow(bx,1)) : FabType::regular;

        if (fabtyp == FabType::covered) {
          AMREX_D_TERM(Array4<Real> const& fxfab = fluxmf[0].array(mfi);,
                       Array4<Real> const& fyfab = fluxmf[1].array(mfi);,
                       Array4<Real> const& fzfab = fluxmf[2].array(mfi););
          AMREX_LAUNCH_HOST_DEVICE_LAMBDA_DIM
          ( xbx, txbx,
            {
                AMREX_LOOP_4D(txbx, AMREX_SPACEDIM, i, j, k, n,
                {
                    fxfab(i,j,k,n) = 0.0;
                });
            }
            , ybx, tybx,
            {
                AMREX_LOOP_4D(tybx, AMREX_SPACEDIM, i, j, k, n,
                {
                    fyfab(i,j,k,n) = 0.0;
                });
            }
            , zbx, tzbx,
            {
                AMREX_LOOP_4D(tzbx, AMREX_SPACEDIM, i, j, k, n,
                {
                    fzfab(i,j,k,n) = 0.0;
                });
            }
          );
        } else {
          AMREX_D_TERM(Array4<Real> const fxfab = fluxmf[0].array(mfi);,
                       Array4<Real> const fyfab = fluxmf[1].array(mfi);,
                       Array4<Real> const fzfab = fluxmf[2].array(mfi););
          Array4<Real const> const vfab = mf.const_array(mfi);
          AMREX_D_TERM(Array4<Real const> const etaxfab = etamf[0].const_array(mfi);,
                       Array4<Real const> const etayfab = etamf[1].const_array(mfi);,
                       Array4<Real const> const etazfab = etamf[2].const_array(mfi););
          AMREX_D_TERM(Array4<Real const> const kapxfab = kapmf[0].const_array(mfi);,
                       Array4<Real const> const kapyfab = kapmf[1].const_array(mfi);,
                       Array4<Real const> const kapzfab = kapmf[2].const_array(mfi););

          if (fabtyp == FabType::regular)
          {
              AMREX_LAUNCH_HOST_DEVICE_LAMBDA_DIM
              ( xbx, txbx,
                {
                  mltensor_cross_terms_fx(txbx,fxfab,vfab,etaxfab,kapxfab,dxinv);
                }
                , ybx, tybx,
                {
                  mltensor_cross_terms_fy(tybx,fyfab,vfab,etayfab,kapyfab,dxinv);
                }
                , zbx, tzbx,
                {
                  mltensor_cross_terms_fz(tzbx,fzfab,vfab,etazfab,kapzfab,dxinv);
                }
              );
          }
          else
          {
            AMREX_D_TERM(Array4<Real const> const& apx = area[0]->const_array(mfi);,
                         Array4<Real const> const& apy = area[1]->const_array(mfi);,
                         Array4<Real const> const& apz = area[2]->const_array(mfi););
            Array4<EBCellFlag const> const& flag = flags->const_array(mfi);

            AMREX_LAUNCH_HOST_DEVICE_LAMBDA_DIM
            ( xbx, txbx,
              {
                mlebtensor_cross_terms_fx(txbx,fxfab,vfab,etaxfab,kapxfab,apx,flag,dxinv);
              }
              , ybx, tybx,
              {
                mlebtensor_cross_terms_fy(tybx,fyfab,vfab,etayfab,kapyfab,apy,flag,dxinv);
              }
              , zbx, tzbx,
              {
                mlebtensor_cross_terms_fz(tzbx,fzfab,vfab,etazfab,kapzfab,apz,flag,dxinv);
              }
              );
          }
        }
    }

    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
        fluxmf[idim].FillBoundary(0, AMREX_SPACEDIM, geom.periodicity());
    }
}